

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void EXRSetNameAttr(EXRHeader *exr_header,char *name)

{
  unsigned_long *puVar1;
  char *in_RSI;
  long in_RDI;
  size_t len;
  unsigned_long local_28;
  size_t local_20;
  size_t local_18;
  char *local_10;
  long local_8;
  
  if ((in_RDI != 0) &&
     (local_10 = in_RSI, local_8 = in_RDI, memset((void *)(in_RDI + 0x88),0,0x100),
     local_10 != (char *)0x0)) {
    local_20 = strlen(local_10);
    local_28 = 0xff;
    puVar1 = std::min<unsigned_long>(&local_20,&local_28);
    local_18 = *puVar1;
    if (local_18 != 0) {
      memcpy((void *)(local_8 + 0x88),local_10,local_18);
    }
  }
  return;
}

Assistant:

void EXRSetNameAttr(EXRHeader* exr_header, const char* name) {
  if (exr_header == NULL) {
    return;
  }
  memset(exr_header->name, 0, 256);
  if (name != NULL) {
    size_t len = std::min(strlen(name), size_t(255));
    if (len) {
      memcpy(exr_header->name, name, len);
    }
  }
}